

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void insertion_sort_suite::sort_1234(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator second_begin;
  iterator second_end;
  undefined1 local_28 [8];
  array<int,_4UL> expect;
  array<int,_4UL> storage;
  
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0x16;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect._M_elems + 2));
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect._M_elems + 2));
  vista::insertion_sort<int*>(pvVar1,pvVar2);
  local_28._0_4_ = 0xb;
  local_28._4_4_ = 0x16;
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect._M_elems + 2));
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect._M_elems + 2));
  second_begin = std::array<int,_4UL>::begin((array<int,_4UL> *)local_28);
  second_end = std::array<int,_4UL>::end((array<int,_4UL> *)local_28);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x596,"void insertion_sort_suite::sort_1234()",pvVar1,pvVar2,second_begin,second_end);
  return;
}

Assistant:

void sort_1234()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    insertion_sort(storage.begin(), storage.end());
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}